

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_then_execute.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  has_then_execute_free_function local_2;
  has_then_execute_member local_1;
  
  test_then_execute<has_then_execute_member>(&local_1);
  test_then_execute<has_then_execute_free_function>(&local_2);
  poVar1 = std::operator<<((ostream *)&std::cout,"OK");
  std::endl<char,std::char_traits<char>>(poVar1);
  return 0;
}

Assistant:

int main()
{
  static_assert(std::experimental::execution::has_then_execute_member<has_then_execute_member>::value, "member then_execute() is not detected."); 
  static_assert(!std::experimental::execution::has_execute_free_function<has_then_execute_member>::value, "free function then_execute() is detected."); 

  static_assert(!std::experimental::execution::has_then_execute_member<has_then_execute_free_function>::value, "member then_execute() is detected."); 
  static_assert(std::experimental::execution::has_then_execute_free_function<has_then_execute_free_function>::value, "free function then_execute() is not detected."); 

  test_then_execute(has_then_execute_member());
  test_then_execute(has_then_execute_free_function());

  std::cout << "OK" << std::endl;
}